

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O3

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::~ResourceReleaseQueue
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this)

{
  string msg;
  string local_30;
  
  if ((this->m_StaleResources).
      super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_StaleResources).
      super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    FormatString<char[37]>(&local_30,(char (*) [37])"Not all stale objects were destroyed");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~ResourceReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0xed);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_ReleaseQueue).
      super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_ReleaseQueue).
      super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    FormatString<char[27]>(&local_30,(char (*) [27])"Release queue is not empty");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~ResourceReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0xee);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
  ::~deque(&this->m_StaleResources);
  std::
  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
  ::~deque(&this->m_ReleaseQueue);
  return;
}

Assistant:

~ResourceReleaseQueue()
    {
        DEV_CHECK_ERR(m_StaleResources.empty(), "Not all stale objects were destroyed");
        DEV_CHECK_ERR(m_ReleaseQueue.empty(), "Release queue is not empty");
    }